

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser.cc
# Opt level: O3

void ctemplate_htmlparser::tag_close(statemachine_ctx *ctx,int start,char chr,int end)

{
  char *__s1;
  void *pvVar1;
  int iVar2;
  undefined4 uVar3;
  
  pvVar1 = ctx->user;
  if (pvVar1 == (void *)0x0) {
    __assert_fail("html != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/htmlparser.cc"
                  ,0x24d,"void ctemplate_htmlparser::tag_close(statemachine_ctx *, int, char, int)")
    ;
  }
  __s1 = (char *)((long)pvVar1 + 0x28);
  iVar2 = strcmp(__s1,"script");
  if (iVar2 == 0) {
    ctx->next_state = 0x1a;
    jsparser_reset(*(jsparser_ctx **)((long)pvVar1 + 0x10));
    uVar3 = 1;
  }
  else {
    iVar2 = strcmp(__s1,"style");
    if (((iVar2 != 0) && (iVar2 = strcmp(__s1,"title"), iVar2 != 0)) &&
       (iVar2 = strcmp(__s1,"textarea"), iVar2 != 0)) {
      return;
    }
    ctx->next_state = 0x1a;
    uVar3 = 0;
  }
  *(undefined4 *)((long)pvVar1 + 0x24) = uVar3;
  return;
}

Assistant:

static void tag_close(statemachine_ctx *ctx, int start, char chr, int end)
{
    htmlparser_ctx *html = CAST(htmlparser_ctx *, ctx->user);
    assert(html != NULL);

    if (strcmp(html->tag, "script") == 0) {
      ctx->next_state = HTMLPARSER_STATE_INT_CDATA_TEXT;
      jsparser_reset(html->jsparser);
      html->in_js = 1;
    } else if (strcmp(html->tag, "style") == 0 ||
               strcmp(html->tag, "title") == 0 ||
               strcmp(html->tag, "textarea") == 0) {
      ctx->next_state = HTMLPARSER_STATE_INT_CDATA_TEXT;
      html->in_js = 0;
    }
}